

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O0

void pd_tilde_dsp(t_pd_tilde *x,t_signal **sp)

{
  int local_2c;
  t_sample **local_28;
  t_sample **g;
  t_signal **pptStack_18;
  int i;
  t_signal **sp_local;
  t_pd_tilde *x_local;
  
  if ((x->x_ninsig == 0) && (x->x_noutsig == 0)) {
    local_2c = 1;
  }
  else {
    local_2c = (*sp)->s_n;
  }
  x->x_blksize = local_2c;
  g._4_4_ = 0;
  local_28 = x->x_insig;
  pptStack_18 = sp;
  for (; g._4_4_ < x->x_ninsig; g._4_4_ = g._4_4_ + 1) {
    *local_28 = (*pptStack_18)->s_vec;
    local_28 = local_28 + 1;
    pptStack_18 = pptStack_18 + 1;
  }
  if (x->x_ninsig == 0) {
    pptStack_18 = pptStack_18 + 1;
  }
  g._4_4_ = 0;
  local_28 = x->x_outsig;
  for (; g._4_4_ < x->x_noutsig; g._4_4_ = g._4_4_ + 1) {
    *local_28 = (*pptStack_18)->s_vec;
    local_28 = local_28 + 1;
    pptStack_18 = pptStack_18 + 1;
  }
  dsp_add(pd_tilde_perform,1,x);
  return;
}

Assistant:

static void pd_tilde_dsp(t_pd_tilde *x, t_signal **sp)
{
    int i;
    t_pdsample **g;

    x->x_blksize = (x->x_ninsig || x->x_noutsig ? sp[0]->s_n : 1);
    for (i = 0, g = x->x_insig; i < x->x_ninsig; i++, g++)
        *g = (*(sp++))->s_vec;
        /* if there were no input signals Pd still provided us with one,
        which we ignore: */
    if (!x->x_ninsig)
        sp++;
    for (i = 0, g = x->x_outsig; i < x->x_noutsig; i++, g++)
        *g = (*(sp++))->s_vec;
    dsp_add(pd_tilde_perform, 1, x);
}